

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dense_main.cc
# Opt level: O3

void __thiscall MyNN::MyNN(MyNN *this)

{
  initializer_list<unsigned_long> __l;
  initializer_list<unsigned_long> __l_00;
  initializer_list<unsigned_long> __l_01;
  initializer_list<unsigned_long> __l_02;
  initializer_list<unsigned_long> __l_03;
  initializer_list<unsigned_long> __l_04;
  initializer_list<unsigned_long> __l_05;
  initializer_list<unsigned_long> __l_06;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  TensorShape w_shape4;
  TensorShape b_shape3;
  TensorShape w_shape3;
  TensorShape b_shape2;
  TensorShape w_shape2;
  TensorShape b_shape4;
  TensorShape b_shape1;
  TensorShape w_shape1;
  allocator_type local_301;
  unsigned_long local_300;
  size_t sStack_2f8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_2f0;
  unsigned_long local_2d8;
  size_t sStack_2d0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_2c8;
  unsigned_long local_2b0;
  size_t sStack_2a8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_2a0;
  unsigned_long local_288;
  size_t sStack_280;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_278;
  unsigned_long local_260;
  size_t sStack_258;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_250;
  unsigned_long local_238;
  size_t sStack_230;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_228;
  unsigned_long local_210;
  size_t sStack_208;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_200;
  TensorShape local_1e8;
  TensorShape local_1b8;
  TensorShape local_188;
  TensorShape local_158;
  TensorShape local_128;
  TensorShape local_f8;
  TensorShape local_c8;
  TensorShape local_98;
  size_t local_68;
  size_t sStack_60;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_58;
  unsigned_long local_40 [2];
  
  (this->super_NN).layers_._M_h._M_buckets = &(this->super_NN).layers_._M_h._M_single_bucket;
  (this->super_NN).layers_._M_h._M_bucket_count = 1;
  (this->super_NN).layers_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->super_NN).layers_._M_h._M_element_count = 0;
  (this->super_NN).layers_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->super_NN).layers_._M_h._M_rehash_policy._M_next_resize = 0;
  (this->super_NN).layers_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->super_NN)._vptr_NN = (_func_int **)&PTR_Forward_0010ebc0;
  local_210 = 2;
  sStack_208 = 0x10;
  local_68 = 2;
  sStack_60 = 0x20;
  __l._M_len = 2;
  __l._M_array = &local_210;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_58,__l,(allocator_type *)&local_260);
  local_260 = 1;
  sStack_258 = 0x10;
  local_210 = 2;
  sStack_208 = 0x10;
  __l_00._M_len = 2;
  __l_00._M_array = &local_260;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_200,__l_00,(allocator_type *)&local_288);
  local_288 = 0x10;
  sStack_280 = 0x20;
  local_260 = 2;
  sStack_258 = 0x200;
  __l_01._M_len = 2;
  __l_01._M_array = &local_288;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_250,__l_01,(allocator_type *)&local_2b0);
  local_2b0 = 1;
  sStack_2a8 = 0x20;
  local_288 = 2;
  sStack_280 = 0x20;
  __l_02._M_len = 2;
  __l_02._M_array = &local_2b0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_278,__l_02,(allocator_type *)&local_2d8);
  local_2d8 = 0x20;
  sStack_2d0 = 0x10;
  local_2b0 = 2;
  sStack_2a8 = 0x200;
  __l_03._M_len = 2;
  __l_03._M_array = &local_2d8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_2a0,__l_03,(allocator_type *)&local_300);
  local_300 = 1;
  sStack_2f8 = 0x10;
  local_2d8 = 2;
  sStack_2d0 = 0x10;
  __l_04._M_len = 2;
  __l_04._M_array = &local_300;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_2c8,__l_04,(allocator_type *)&local_238);
  local_238 = 0x10;
  sStack_230 = 1;
  local_300 = 2;
  sStack_2f8 = 0x10;
  __l_05._M_len = 2;
  __l_05._M_array = &local_238;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_2f0,__l_05,(allocator_type *)local_40);
  local_40[0] = 1;
  local_40[1] = 1;
  local_238 = 2;
  sStack_230 = 1;
  __l_06._M_len = 2;
  __l_06._M_array = local_40;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_228,__l_06,&local_301);
  local_98.dim = local_68;
  local_98.total = sStack_60;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_98.dims,&local_58);
  local_c8.dim = local_210;
  local_c8.total = sStack_208;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_c8.dims,&local_200);
  name._M_str = "dense1";
  name._M_len = 6;
  yyml::nn::NN::SetLayer<yyml::nn::DenseLayer,yyml::TensorShape,yyml::TensorShape>
            (&this->super_NN,name,&local_98,&local_c8);
  if (local_c8.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.dims.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.dims.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_98.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.dims.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.dims.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_f8.dim = local_260;
  local_f8.total = sStack_258;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_f8.dims,&local_250);
  local_128.dim = local_288;
  local_128.total = sStack_280;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_128.dims,&local_278);
  name_00._M_str = "dense2";
  name_00._M_len = 6;
  yyml::nn::NN::SetLayer<yyml::nn::DenseLayer,yyml::TensorShape,yyml::TensorShape>
            (&this->super_NN,name_00,&local_f8,&local_128);
  if (local_128.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_128.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_128.dims.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.dims.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_f8.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_f8.dims.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.dims.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_158.dim = local_2b0;
  local_158.total = sStack_2a8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_158.dims,&local_2a0);
  local_188.dim = local_2d8;
  local_188.total = sStack_2d0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_188.dims,&local_2c8);
  name_01._M_str = "dense3";
  name_01._M_len = 6;
  yyml::nn::NN::SetLayer<yyml::nn::DenseLayer,yyml::TensorShape,yyml::TensorShape>
            (&this->super_NN,name_01,&local_158,&local_188);
  if (local_188.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_188.dims.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_188.dims.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_158.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_158.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_158.dims.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_158.dims.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_1b8.dim = local_300;
  local_1b8.total = sStack_2f8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_1b8.dims,&local_2f0);
  local_1e8.dim = local_238;
  local_1e8.total = sStack_230;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_1e8.dims,&local_228);
  name_02._M_str = "dense4";
  name_02._M_len = 6;
  yyml::nn::NN::SetLayer<yyml::nn::DenseLayer,yyml::TensorShape,yyml::TensorShape>
            (&this->super_NN,name_02,&local_1b8,&local_1e8);
  if (local_1e8.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e8.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1e8.dims.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e8.dims.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1b8.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1b8.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1b8.dims.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b8.dims.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_228.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_228.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_2f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_2f0.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2f0.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_2c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_2c8.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2c8.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_2a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_2a0.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2a0.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_250.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_250.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_250.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_250.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_200.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_200.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_200.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_200.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

MyNN() {
    TensorShape w_shape1{2, 16}, b_shape1{1, 16};
    TensorShape w_shape2{16, 32}, b_shape2{1, 32};
    TensorShape w_shape3{32, 16}, b_shape3{1, 16};
    TensorShape w_shape4{16, 1}, b_shape4{1, 1};
    SetLayer<DenseLayer>("dense1", w_shape1, b_shape1);
    SetLayer<DenseLayer>("dense2", w_shape2, b_shape2);
    SetLayer<DenseLayer>("dense3", w_shape3, b_shape3);
    SetLayer<DenseLayer>("dense4", w_shape4, b_shape4);
  }